

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall
absl::log_internal::LogMessage::LogMessageData::LogMessageData
          (LogMessageData *this,char *file,int line,LogSeverity severity,Time timestamp)

{
  bool bVar1;
  LogSeverity LVar2;
  pid_t pVar3;
  size_t sVar4;
  anon_unknown_2 *this_00;
  char *extraout_RDX;
  LogSeverity LVar5;
  string_view sVar6;
  
  LogEntry::LogEntry(&this->entry);
  (this->extra_sinks).storage_.metadata_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::LogSink_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_1UL,_false>.value = 0;
  this->extra_sinks_only = false;
  std::ostream::ostream(&this->manipulated,(streambuf *)0x0);
  (this->encoded_remaining).ptr_ = (this->encoded_buf)._M_elems;
  (this->encoded_remaining).len_ = 15000;
  *(uint *)(&this->field_0x138 + *(long *)(*(long *)&this->manipulated + -0x18)) =
       *(uint *)(&this->field_0x138 + *(long *)(*(long *)&this->manipulated + -0x18)) | 0x201;
  sVar4 = strlen(file);
  (this->entry).full_filename_._M_len = sVar4;
  (this->entry).full_filename_._M_str = file;
  this_00 = (anon_unknown_2 *)strlen(file);
  sVar6._M_str = extraout_RDX;
  sVar6._M_len = (size_t)file;
  sVar6 = anon_unknown_2::Basename(this_00,sVar6);
  (this->entry).base_filename_ = sVar6;
  (this->entry).line_ = line;
  bVar1 = ShouldPrependLogPrefix();
  (this->entry).prefix_ = bVar1;
  LVar5 = kInfo;
  if (0 < (int)severity) {
    LVar5 = severity;
  }
  LVar2 = kError;
  if ((int)severity < 4) {
    LVar2 = LVar5;
  }
  (this->entry).severity_ = LVar2;
  (this->entry).verbose_level_ = -1;
  (this->entry).timestamp_.rep_.rep_hi_ = timestamp.rep_.rep_hi_;
  (this->entry).timestamp_.rep_.rep_lo_ = timestamp.rep_.rep_lo_;
  pVar3 = base_internal::GetCachedTID();
  (this->entry).tid_ = pVar3;
  return;
}

Assistant:

LogMessage::LogMessageData::LogMessageData(const char* file, int line,
                                           absl::LogSeverity severity,
                                           absl::Time timestamp)
    : extra_sinks_only(false),
      manipulated(nullptr),
      // This `absl::MakeSpan` silences spurious -Wuninitialized from GCC:
      encoded_remaining(absl::MakeSpan(encoded_buf)) {
  // Legacy defaults for LOG's ostream:
  manipulated.setf(std::ios_base::showbase | std::ios_base::boolalpha);
  entry.full_filename_ = file;
  entry.base_filename_ = Basename(file);
  entry.line_ = line;
  entry.prefix_ = absl::ShouldPrependLogPrefix();
  entry.severity_ = absl::NormalizeLogSeverity(severity);
  entry.verbose_level_ = absl::LogEntry::kNoVerbosityLevel;
  entry.timestamp_ = timestamp;
  entry.tid_ = absl::base_internal::GetCachedTID();
}